

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>
::dx(FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>
  *this_00;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar5;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar6;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar7;
  value_type vVar8;
  value_type vVar9;
  double dVar10;
  
  vVar8 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>::dx
                    (&this->left_->fadexpr_,i);
  this_00 = &this->right_->fadexpr_;
  iVar3 = (this_00->left_->fadexpr_).left_.constant_;
  dVar1 = ((this_00->left_->fadexpr_).right_)->val_;
  iVar4 = (this_00->right_->fadexpr_).left_.constant_;
  dVar2 = ((this_00->right_->fadexpr_).right_)->val_;
  vVar9 = FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>
          ::dx(this_00,i);
  pFVar5 = (this->left_->fadexpr_).left_;
  pFVar6 = (this->right_->fadexpr_).left_;
  pFVar7 = (this->right_->fadexpr_).right_;
  dVar10 = ((double)(pFVar7->fadexpr_).left_.constant_ + ((pFVar7->fadexpr_).right_)->val_) *
           ((double)(pFVar6->fadexpr_).left_.constant_ + ((pFVar6->fadexpr_).right_)->val_);
  return (((double)iVar4 + dVar2) * ((double)iVar3 + dVar1) * vVar8 -
         ((pFVar5->fadexpr_).left_)->val_ * ((pFVar5->fadexpr_).right_)->val_ *
         ((this->left_->fadexpr_).right_)->val_ * vVar9) / (dVar10 * dVar10);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}